

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O1

DispatchCallResult __thiscall
capnproto_test::capnp::test::TestStreaming::Server::dispatchCallInternal
          (Server *this,uint16_t methodId,CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  int iVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined6 in_register_00000032;
  long *plVar3;
  Exception *e;
  DispatchCallResult DVar4;
  NullableValue<kj::Exception> _e1576;
  _func_int **local_4f0 [153];
  undefined8 uVar2;
  
  plVar3 = (long *)CONCAT62(in_register_00000032,methodId);
  iVar1 = (int)context.hook;
  if (iVar1 == 2) {
    (**(code **)(*plVar3 + 0x18))(this);
    *(undefined2 *)&this->field_0x8 = 0x100;
    uVar2 = extraout_RDX_01;
  }
  else {
    if (iVar1 == 1) {
      this->_vptr_Server = (_func_int **)0x0;
      (**(code **)(*plVar3 + 0x10))(local_4f0);
      this->_vptr_Server = local_4f0[0];
      uVar2 = extraout_RDX_00;
    }
    else {
      if (iVar1 != 0) {
        DVar4 = ::capnp::Capability::Server::internalUnimplemented
                          ((Server *)this,(char *)((long)plVar3 + *(long *)(*plVar3 + -0x18)),
                           0x578646,0xedbe);
        uVar2 = DVar4._8_8_;
        goto LAB_002ea2a8;
      }
      this->_vptr_Server = (_func_int **)0x0;
      (**(code **)(*plVar3 + 8))(local_4f0);
      this->_vptr_Server = local_4f0[0];
      uVar2 = extraout_RDX;
    }
    *(undefined2 *)&this->field_0x8 = 0x101;
  }
LAB_002ea2a8:
  DVar4.isStreaming = (bool)(char)uVar2;
  DVar4.allowCancellation = (bool)(char)((ulong)uVar2 >> 8);
  DVar4._10_6_ = (int6)((ulong)uVar2 >> 0x10);
  DVar4.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this;
  return DVar4;
}

Assistant:

::capnp::Capability::Server::DispatchCallResult TestStreaming::Server::dispatchCallInternal(
    uint16_t methodId,
    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {
  switch (methodId) {
    case 0:
      return {
        kj::evalNow([&]() {
          return doStreamI(::capnp::Capability::Server::internalGetTypedStreamingContext<
               ::capnproto_test::capnp::test::TestStreaming::DoStreamIParams>(context));
        }),
        true,
        true
      };
    case 1:
      return {
        kj::evalNow([&]() {
          return doStreamJ(::capnp::Capability::Server::internalGetTypedStreamingContext<
               ::capnproto_test::capnp::test::TestStreaming::DoStreamJParams>(context));
        }),
        true,
        true
      };
    case 2:
      return {
        finishStream(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestStreaming::FinishStreamParams,  ::capnproto_test::capnp::test::TestStreaming::FinishStreamResults>(context)),
        false,
        true
      };
    default:
      (void)context;
      return ::capnp::Capability::Server::internalUnimplemented(
          "capnp/test.capnp:TestStreaming",
          0xd9d44ddacab3edbeull, methodId);
  }
}